

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseSimdLane(WastParser *this,Location loc,uint64_t *lane_idx)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result result_00;
  Literal *pLVar2;
  size_type sVar3;
  const_pointer pvVar4;
  ParseIntType in_R8D;
  undefined8 in_R9;
  string_view v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  undefined1 local_c8 [4];
  Result result;
  Literal literal;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  iterator local_48;
  size_type local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  ulong *local_20;
  uint64_t *lane_idx_local;
  WastParser *this_local;
  
  local_20 = lane_idx;
  lane_idx_local = (uint64_t *)this;
  bVar1 = PeekMatch(this,Last_Literal,0);
  if ((!bVar1) && (bVar1 = PeekMatch(this,Int,0), !bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"a natural number in range [0, 32)",
               (allocator<char> *)((long)&literal.text._M_str + 7));
    local_48 = &local_68;
    local_40 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&literal.text._M_str + 6));
    __l._M_len = local_40;
    __l._M_array = local_48;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_38,__l,(allocator_type *)((long)&literal.text._M_str + 6));
    this_local._4_4_ = ErrorExpected(this,&local_38,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&literal.text._M_str + 6));
    local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
    do {
      local_140 = local_140 + -1;
      std::__cxx11::string::~string((string *)local_140);
    } while (local_140 != &local_68);
    std::allocator<char>::~allocator((allocator<char> *)((long)&literal.text._M_str + 7));
    return (Result)this_local._4_4_;
  }
  Consume((Token *)local_c8,this);
  pLVar2 = Token::literal((Token *)local_c8);
  literal._0_8_ = (pLVar2->text)._M_len;
  literal.text._M_len = (size_t)(pLVar2->text)._M_str;
  v._M_str = (char *)local_20;
  v._M_len = literal.text._M_len;
  result_00 = ParseInt64((wabt *)literal._0_8_,v,(uint64_t *)0x0,in_R8D);
  bVar1 = Failed(result_00);
  if (bVar1) {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&literal);
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&literal);
    Error(this,loc,"invalid literal \"%.*s\"",sVar3 & 0xffffffff,pvVar4,loc.field_1.field_1.offset,
          in_R9);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else if (*local_20 < 0x100) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&literal);
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&literal);
    Error(this,loc,"lane index \"%.*s\" out-of-range [0, 32)",sVar3 & 0xffffffff,pvVar4,
          loc.field_1.field_1.offset,in_R9);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseSimdLane(Location loc, uint64_t* lane_idx) {
  if (!PeekMatch(TokenType::Nat) && !PeekMatch(TokenType::Int)) {
    return ErrorExpected({"a natural number in range [0, 32)"});
  }

  Literal literal = Consume().literal();

  Result result =
      ParseInt64(literal.text, lane_idx, ParseIntType::UnsignedOnly);

  if (Failed(result)) {
    Error(loc, "invalid literal \"" PRIstringview "\"",
          WABT_PRINTF_STRING_VIEW_ARG(literal.text));
    return Result::Error;
  }

  // The valid range is only [0, 32), but it's only malformed if it can't
  // fit in a byte.
  if (*lane_idx > 255) {
    Error(loc, "lane index \"" PRIstringview "\" out-of-range [0, 32)",
          WABT_PRINTF_STRING_VIEW_ARG(literal.text));
    return Result::Error;
  }

  return Result::Ok;
}